

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::inmem_log_store::pack(inmem_log_store *this,ulong index,int32 cnt)

{
  buffer *this_00;
  pointer psVar1;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  lock_guard<std::mutex> l;
  shared_ptr<nuraft::buffer> *entry;
  long lVar4;
  pointer psVar5;
  ptr<buffer> pVar6;
  ptr<log_entry> le;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_> logs;
  ptr<buffer> buf;
  ulong local_80;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> local_78;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_68;
  long local_50;
  ulong local_48;
  buffer *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_80 = CONCAT44(in_register_00000014,cnt);
  local_68.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = (long)in_ECX;
  local_48 = local_50 + local_80;
  lVar4 = 0;
  for (; local_80 < local_48; local_80 = local_80 + 1) {
    local_78._M_ptr = (element_type *)0x0;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(index + 0x38))->__data);
    p_Var2 = &std::
              map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
              ::operator[]((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                            *)(index + 8),&local_80)->
              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_78,p_Var2);
    pthread_mutex_unlock((pthread_mutex_t *)(index + 0x38));
    log_entry::serialize((log_entry *)&local_40);
    sVar3 = buffer::size(local_40);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::push_back(&local_68,(value_type *)&local_40);
    lVar4 = lVar4 + sVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  }
  buffer::alloc((buffer *)this,lVar4 + local_50 * 4 + 4);
  buffer::pos((buffer *)(this->super_log_store)._vptr_log_store,0);
  buffer::put((buffer *)(this->super_log_store)._vptr_log_store,in_ECX);
  psVar1 = local_68.
           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = local_68.
                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    this_00 = (buffer *)(this->super_log_store)._vptr_log_store;
    sVar3 = buffer::size((psVar5->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    buffer::put(this_00,(int32)sVar3);
    buffer::put((buffer *)(this->super_log_store)._vptr_log_store,
                (psVar5->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(&local_68);
  pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> inmem_log_store::pack(ulong index, int32 cnt) {
    std::vector< ptr<buffer> > logs;

    size_t size_total = 0;
    for (ulong ii=index; ii<index+cnt; ++ii) {
        ptr<log_entry> le = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            le = logs_[ii];
        }
        assert(le.get());
        ptr<buffer> buf = le->serialize();
        size_total += buf->size();
        logs.push_back( buf );
    }

    ptr<buffer> buf_out = buffer::alloc
                          ( sizeof(int32) +
                            cnt * sizeof(int32) +
                            size_total );
    buf_out->pos(0);
    buf_out->put((int32)cnt);

    for (auto& entry: logs) {
        ptr<buffer>& bb = entry;
        buf_out->put((int32)bb->size());
        buf_out->put(*bb);
    }
    return buf_out;
}